

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O0

void writeProperty(FILE *fout,string *targetName,string *prop,string *value)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  string local_68;
  string local_48;
  string *local_28;
  string *value_local;
  string *prop_local;
  string *targetName_local;
  FILE *fout_local;
  
  local_28 = value;
  value_local = prop;
  prop_local = targetName;
  targetName_local = (string *)fout;
  uVar1 = std::__cxx11::string::c_str();
  cmOutputConverter::EscapeForCMake(&local_48,value_local);
  uVar2 = std::__cxx11::string::c_str();
  cmOutputConverter::EscapeForCMake(&local_68,local_28);
  uVar3 = std::__cxx11::string::c_str();
  fprintf((FILE *)fout,"set_property(TARGET %s PROPERTY %s %s)\n",uVar1,uVar2,uVar3);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

static void writeProperty(FILE* fout, std::string const& targetName,
                          std::string const& prop, std::string const& value)
{
  fprintf(fout, "set_property(TARGET %s PROPERTY %s %s)\n", targetName.c_str(),
          cmOutputConverter::EscapeForCMake(prop).c_str(),
          cmOutputConverter::EscapeForCMake(value).c_str());
}